

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void nuts_tran_listen_accept(char *scheme)

{
  _Bool _Var1;
  nng_err nVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  nng_url *local_40;
  nng_url *url;
  nng_dialer local_30;
  nng_listener l1;
  nng_dialer d1;
  nng_dialer d2;
  nng_socket s1;
  nng_socket s2;
  
  d1.id = 0;
  d2.id = 0;
  url._4_4_ = 0;
  local_30.id = 0;
  l1.id = 0;
  pcVar5 = strchr(scheme,0x36);
  if (pcVar5 != (char *)0x0) {
    _Var1 = nuts_has_ipv6();
    if (!_Var1) {
      acutest_skip_("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                    ,0x15e,"No IPv6 support present");
      return;
    }
  }
  nuts_scratch_addr_zero(scheme,0x40,nuts_tran_listen_accept::nuts_addr_);
  nVar2 = nng_pair1_open((nng_socket *)&d1);
  pcVar5 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                         ,0x160,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar5,
                         nVar2);
  if (iVar3 != 0) {
    nVar2 = nng_pair1_open((nng_socket *)&d2);
    pcVar5 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x161,"%s: expected success, got %s (%d)","nng_pair1_open(&(s2))",pcVar5
                           ,nVar2);
    if (iVar3 != 0) {
      nVar2 = nng_socket_set_ms((nng_socket)d1.id,"send-timeout",100);
      pcVar5 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                             ,0x162,"%s: expected success, got %s (%d)",
                             "nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100)",pcVar5,nVar2);
      if (iVar3 != 0) {
        nVar2 = nng_socket_set_ms((nng_socket)d2.id,"send-timeout",100);
        pcVar5 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                               ,0x163,"%s: expected success, got %s (%d)",
                               "nng_socket_set_ms(s2, NNG_OPT_SENDTIMEO, 100)",pcVar5,nVar2);
        if (iVar3 != 0) {
          nVar2 = nng_socket_set_ms((nng_socket)d1.id,"recv-timeout",100);
          pcVar5 = nng_strerror(nVar2);
          iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                 ,0x164,"%s: expected success, got %s (%d)",
                                 "nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 100)",pcVar5,nVar2);
          if (iVar3 != 0) {
            nVar2 = nng_socket_set_ms((nng_socket)d2.id,"recv-timeout",100);
            pcVar5 = nng_strerror(nVar2);
            iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                   ,0x165,"%s: expected success, got %s (%d)",
                                   "nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 100)",pcVar5,nVar2);
            if (iVar3 != 0) {
              nVar2 = nng_listen((nng_socket)d1.id,nuts_tran_listen_accept::nuts_addr_,
                                 (nng_listener *)((long)&url + 4),0);
              pcVar5 = nng_strerror(nVar2);
              iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                     ,0x166,"%s: expected success, got %s (%d)",
                                     "nng_listen(s1, addr, &l1, 0)",pcVar5,nVar2);
              if (iVar3 != 0) {
                nVar2 = nng_listener_get_url(url._4_4_,&local_40);
                pcVar5 = nng_strerror(nVar2);
                iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                       ,0x167,"%s: expected success, got %s (%d)",
                                       "nng_listener_get_url(l1, &url)",pcVar5,nVar2);
                if (iVar3 != 0) {
                  nVar2 = nng_dial_url((nng_socket)d2.id,local_40,&local_30,0);
                  pcVar5 = nng_strerror(nVar2);
                  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                         ,0x168,"%s: expected success, got %s (%d)",
                                         "nng_dial_url(s2, url, &d1, 0)",pcVar5,nVar2);
                  if (iVar3 != 0) {
                    nVar2 = nng_dial_url((nng_socket)d2.id,local_40,(nng_dialer *)&l1,0);
                    pcVar5 = nng_strerror(nVar2);
                    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                           ,0x169,"%s: expected success, got %s (%d)",
                                           "nng_dial_url(s2, url, &d2, 0)",pcVar5,nVar2);
                    if (iVar3 != 0) {
                      iVar3 = nng_listener_id(url._4_4_);
                      acutest_check_((uint)(0 < iVar3),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                     ,0x16a,"%s","nng_listener_id(l1) > 0");
                      iVar3 = nng_dialer_id(local_30);
                      acutest_check_((uint)(0 < iVar3),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                     ,0x16b,"%s","nng_dialer_id(d1) > 0");
                      iVar3 = nng_dialer_id((nng_dialer)l1.id);
                      acutest_check_((uint)(0 < iVar3),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                     ,0x16c,"%s","nng_dialer_id(d2) > 0");
                      iVar3 = nng_dialer_id(local_30);
                      iVar4 = nng_dialer_id((nng_dialer)l1.id);
                      acutest_check_((uint)(iVar3 != iVar4),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                     ,0x16d,"%s","nng_dialer_id(d1) != nng_dialer_id(d2)");
                      nVar2 = nng_socket_close((nng_socket)d1.id);
                      pcVar5 = nng_strerror(nVar2);
                      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                             ,0x16e,"%s: expected success, got %s (%d)",
                                             "nng_socket_close(s1)",pcVar5,nVar2);
                      if (iVar3 != 0) {
                        nVar2 = nng_socket_close((nng_socket)d2.id);
                        pcVar5 = nng_strerror(nVar2);
                        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                               ,0x16f,"%s: expected success, got %s (%d)",
                                               "nng_socket_close(s2)",pcVar5,nVar2);
                        if (iVar3 != 0) {
                          return;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
nuts_tran_listen_accept(const char *scheme)
{
	nng_socket     s1 = NNG_SOCKET_INITIALIZER;
	nng_socket     s2 = NNG_SOCKET_INITIALIZER;
	nng_listener   l1 = NNG_LISTENER_INITIALIZER;
	nng_dialer     d1 = NNG_LISTENER_INITIALIZER;
	nng_dialer     d2 = NNG_LISTENER_INITIALIZER;
	const char    *addr;
	const nng_url *url;

	NUTS_SKIP_IF_IPV6_NEEDED_AND_ABSENT(scheme);
	NUTS_ADDR_ZERO(addr, scheme);
	NUTS_OPEN(s1);
	NUTS_OPEN(s2);
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s2, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_listen(s1, addr, &l1, 0));
	NUTS_PASS(nng_listener_get_url(l1, &url));
	NUTS_PASS(nng_dial_url(s2, url, &d1, 0));
	NUTS_PASS(nng_dial_url(s2, url, &d2, 0));
	NUTS_TRUE(nng_listener_id(l1) > 0);
	NUTS_TRUE(nng_dialer_id(d1) > 0);
	NUTS_TRUE(nng_dialer_id(d2) > 0);
	NUTS_TRUE(nng_dialer_id(d1) != nng_dialer_id(d2));
	NUTS_CLOSE(s1);
	NUTS_CLOSE(s2);
}